

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

bool __thiscall
QListModel::moveRows
          (QListModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  char cVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long in_FS_OFFSET;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < sourceRow) {
    iVar2 = (**(code **)(*(long *)this + 0x78))();
    bVar4 = false;
    if ((destinationChild < 0) || (iVar2 < count + sourceRow)) goto LAB_0057ac14;
    iVar2 = (**(code **)(*(long *)this + 0x78))(this,destinationParent);
    bVar4 = false;
    if ((sourceRow == destinationChild) || (bVar4 = false, iVar2 < destinationChild))
    goto LAB_0057ac14;
    if (((0 < count && destinationChild + -1 != sourceRow) &&
        (((sourceParent->r < 0 || (sourceParent->c < 0)) ||
         ((sourceParent->m).ptr == (QAbstractItemModel *)0x0)))) &&
       (((destinationParent->r < 0 || (destinationParent->c < 0)) ||
        ((destinationParent->m).ptr == (QAbstractItemModel *)0x0)))) {
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      local_68 = 0xffffffffffffffff;
      local_60 = 0;
      uStack_58 = 0;
      cVar1 = QAbstractItemModel::beginMoveRows
                        ((QModelIndex *)this,(int)&local_50,sourceRow,
                         (QModelIndex *)(ulong)((count + sourceRow) - 1),(int)&local_68);
      bVar4 = false;
      if (cVar1 != '\0') {
        iVar3 = destinationChild + -1;
        iVar2 = 0;
        if ((uint)destinationChild < (uint)sourceRow) {
          iVar3 = destinationChild;
          iVar2 = count + -1;
        }
        do {
          QList<QListWidgetItem_*>::move(&this->items,(ulong)(uint)(iVar2 + sourceRow),(long)iVar3);
          count = count + -1;
        } while (count != 0);
        QAbstractItemModel::endMoveRows();
        bVar4 = true;
      }
      goto LAB_0057ac14;
    }
  }
  bVar4 = false;
LAB_0057ac14:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QListModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceRow < 0
        || sourceRow + count - 1 >= rowCount(sourceParent)
        || destinationChild < 0
        || destinationChild > rowCount(destinationParent)
        || sourceRow == destinationChild
        || sourceRow == destinationChild - 1
        || count <= 0
        || sourceParent.isValid()
        || destinationParent.isValid()) {
        return false;
    }
    if (!beginMoveRows(QModelIndex(), sourceRow, sourceRow + count - 1, QModelIndex(), destinationChild))
        return false;

    int fromRow = sourceRow;
    if (destinationChild < sourceRow)
        fromRow += count - 1;
    else
        destinationChild--;
    while (count--)
        items.move(fromRow, destinationChild);
    endMoveRows();
    return true;
}